

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::printLineWidthError
          (LineRenderCase *this,IVec2 *pos,int detectedLineWidth,IVec2 *lineWidthRange,
          bool isHorizontal,int *messageLimitCounter)

{
  ostringstream *this_00;
  char *pcVar1;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  *messageLimitCounter = *messageLimitCounter + -1;
  if (-1 < *messageLimitCounter) {
    local_1a8._0_8_ =
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Found incorrect line width near ",0x20);
    tcu::operator<<((ostream *)this_00,pos);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": (",3);
    pcVar1 = "uni_atom_vertical";
    if (isHorizontal) {
      pcVar1 = "uni_atom_horizontal";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar1 + 9,(ulong)isHorizontal * 2 + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," line)\n",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"\tExpected line width in range [",0x1f);
    std::ostream::operator<<(this_00,lineWidthRange->m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,lineWidthRange->m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] but found ",0xc);
    std::ostream::operator<<(this_00,detectedLineWidth);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
  }
  return;
}

Assistant:

void LineRenderCase::printLineWidthError (const tcu::IVec2& pos, int detectedLineWidth, const tcu::IVec2& lineWidthRange, bool isHorizontal, int& messageLimitCounter) const
{
	if (--messageLimitCounter < 0)
		return;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Found incorrect line width near " << pos << ": (" << ((isHorizontal) ? ("horizontal") : ("vertical")) << " line)\n"
			<< "\tExpected line width in range [" << lineWidthRange.x() << ", " << lineWidthRange.y() << "] but found " << detectedLineWidth
		<< tcu::TestLog::EndMessage;
}